

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

bool __thiscall
testing::internal::
TypedExpectation<TestResult_(mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>)>
::ShouldHandleArguments
          (TypedExpectation<TestResult_(mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>)>
           *this,ArgumentTuple *args)

{
  bool bVar1;
  TypedExpectation<TestResult_(mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>)>
  *in_RSI;
  ExpectationBase *in_RDI;
  MutexBase *in_stack_00000010;
  ExpectationBase *in_stack_00000220;
  uint7 in_stack_ffffffffffffffe8;
  bool bVar2;
  
  MutexBase::AssertHeld(in_stack_00000010);
  ExpectationBase::CheckActionCountIfNotDone(in_stack_00000220);
  bVar1 = ExpectationBase::is_retired(in_RDI);
  bVar2 = false;
  if (!bVar1) {
    bVar1 = ExpectationBase::AllPrerequisitesAreSatisfied
                      ((ExpectationBase *)(ulong)in_stack_ffffffffffffffe8);
    bVar2 = false;
    if (bVar1) {
      bVar2 = Matches(in_RSI,(ArgumentTuple *)(ulong)in_stack_ffffffffffffffe8);
    }
  }
  return bVar2;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();

    // In case the action count wasn't checked when the expectation
    // was defined (e.g. if this expectation has no WillRepeatedly()
    // or RetiresOnSaturation() clause), we check it when the
    // expectation is used for the first time.
    CheckActionCountIfNotDone();
    return !is_retired() && AllPrerequisitesAreSatisfied() && Matches(args);
  }